

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.cpp
# Opt level: O0

void helics::detail::convertFromBinary(byte *data,double *val)

{
  size_t sVar1;
  byte *data_00;
  byte *in_RSI;
  byte *in_RDI;
  double *end;
  double *currentVal;
  size_t size;
  byte *local_28;
  
  sVar1 = getDataSize(in_RDI);
  if ((in_RSI != (byte *)0x0) && (sVar1 != 0)) {
    memcpy(in_RSI,in_RDI + 8,sVar1 << 3);
  }
  if ((*in_RDI & 1) != 0) {
    data_00 = in_RSI + sVar1 * 8;
    local_28 = in_RSI;
    while (local_28 != data_00) {
      local_28 = local_28 + 8;
      checks::swapBytes<8ul>(data_00);
    }
  }
  return;
}

Assistant:

void convertFromBinary(const std::byte* data, double* val)
{
    const std::size_t size = getDataSize(data);
    if (val != nullptr && size > 0) {
        std::memcpy(val, data + 8, size * sizeof(double));
    }
    if ((data[0] & endianMask) != littleEndianCode) {
        double* currentVal = val;
        double* end = currentVal + size;
        while (currentVal != end) {
            checks::swapBytes<8>(reinterpret_cast<std::byte*>(currentVal++));
        }
    }
}